

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unrolling.cpp
# Opt level: O0

VarId __thiscall optimization::loop_unrolling::loop_info::copy_var(loop_info *this,VarId *var)

{
  pair<const_unsigned_int,_mir::inst::Variable> *in_RDX;
  undefined8 extraout_RDX;
  value_type *in_RSI;
  Displayable in_RDI;
  VarId VVar1;
  iterator end_iter;
  VarId *new_var;
  Variable *__y;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *__k;
  Variable local_20;
  
  __k = (map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
         *)in_RDI._vptr_Displayable;
  local_20.super_Displayable._vptr_Displayable =
       (_func_int **)
       std::
       map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
       ::end(in_RDI._vptr_Displayable);
  __y = &local_20;
  std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>::operator--
            ((_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_> *)in_RSI,
             (int)((ulong)__y >> 0x20));
  std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>::operator->
            ((_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_> *)0x1f2028);
  mir::inst::VarId::VarId((VarId *)__y,(uint32_t)((ulong)in_RDI._vptr_Displayable >> 0x20));
  std::
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
        *)((in_RSI->second).super_Displayable._vptr_Displayable + 7),(key_type_conflict *)__k);
  std::pair<const_unsigned_int,_mir::inst::Variable>::
  pair<mir::inst::VarId_&,_mir::inst::Variable_&,_true>(in_RDX,(VarId *)in_RSI,__y);
  std::
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  ::insert((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
            *)in_RDX,in_RSI);
  std::pair<const_unsigned_int,_mir::inst::Variable>::~pair
            ((pair<const_unsigned_int,_mir::inst::Variable> *)0x1f20a3);
  VVar1._8_8_ = extraout_RDX;
  VVar1.super_Displayable._vptr_Displayable = in_RDI._vptr_Displayable;
  return VVar1;
}

Assistant:

mir::inst::VarId copy_var(mir::inst::VarId var) {
    auto end_iter = func.variables.end();
    end_iter--;
    mir::inst::VarId new_var(end_iter->first + 1);
    func.variables.insert({new_var, func.variables.at(var.id)});
    return new_var;
  }